

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O1

void normalizeFloatx80Subnormal_mips64(uint64_t aSig,int32_t *zExpPtr,uint64_t *zSigPtr)

{
  long lVar1;
  uint uVar2;
  
  if (aSig == 0) {
    uVar2 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (aSig != 0) {
      for (; aSig >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = (uint)lVar1 ^ 0x3f;
  }
  *zSigPtr = aSig << ((byte)uVar2 & 0x3f);
  *zExpPtr = 1 - uVar2;
  return;
}

Assistant:

static inline int clz64(uint64_t val)
{
#ifndef _MSC_VER
    return val ? __builtin_clzll(val) : 64;
#else
    int cnt = 0;

    if (!(val >> 32)) {
        cnt += 32;
    } else {
        val >>= 32;
    }

    return cnt + clz32((uint32_t)val);
#endif
}